

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  size_type __len1;
  int iVar2;
  XMLError error;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string filename;
  string api;
  VulkanHppGenerator generator;
  XMLDocument doc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  VulkanHppGenerator local_8a8;
  XMLDocument local_338;
  
  if ((argc & 1U) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "VulkanHppGenerator usage: VulkanHppGenerator [-f filename][-api [vulkan|vulkansc]]",
               0x52);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tdefault for filename is <",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/vk.xml"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tdefault for api <vulkan>",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tsupported values for api are <vulkan> and <vulkansc>",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    return -1;
  }
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"vulkan","");
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e8,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/Vulkan-Headers/registry/vk.xml"
             ,"");
  if (1 < argc) {
    lVar5 = 1;
    do {
      pcVar1 = argv[lVar5];
      iVar2 = strcmp(pcVar1,"-api");
      this = &local_8c8;
      if ((iVar2 != 0) &&
         (((*pcVar1 != '-' || (pcVar1[1] != 'f')) || (this = &local_8e8, pcVar1[2] != '\0')))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"unsupported argument <",0x16);
        pcVar1 = argv[lVar5];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x27e268);
        }
        else {
          sVar3 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        iVar2 = -1;
        std::ostream::flush();
        goto LAB_001eb528;
      }
      pcVar1 = argv[lVar5 + 1];
      __len1 = this->_M_string_length;
      sVar3 = strlen(pcVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (this,0,__len1,pcVar1,sVar3);
      lVar5 = lVar5 + 2;
    } while ((int)lVar5 < argc);
  }
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_8c8,"vulkan");
  if ((iVar2 == 0) ||
     (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_8c8,"vulkansc"), iVar2 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "VulkanHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n"
               ,0x68);
    tinyxml2::XMLDocument::XMLDocument(&local_338,true,PRESERVE_WHITESPACE);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"VulkanHppGenerator: Loading ",0x1c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_8e8._M_dataplus._M_p,local_8e8._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    error = tinyxml2::XMLDocument::LoadFile(&local_338,local_8e8._M_dataplus._M_p);
    if (error == XML_SUCCESS) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"VulkanHppGenerator: Parsing ",0x1c);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_8e8._M_dataplus._M_p,
                          local_8e8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      VulkanHppGenerator::VulkanHppGenerator(&local_8a8,&local_338,&local_8c8);
      VulkanHppGenerator::prepareRAIIHandles(&local_8a8);
      VulkanHppGenerator::generateCppModuleFile(&local_8a8);
      VulkanHppGenerator::generateHppFile(&local_8a8);
      VulkanHppGenerator::generateEnumsHppFile(&local_8a8);
      VulkanHppGenerator::generateExtensionInspectionFile(&local_8a8);
      VulkanHppGenerator::generateFormatTraitsHppFile(&local_8a8);
      VulkanHppGenerator::generateFuncsHppFile(&local_8a8);
      VulkanHppGenerator::generateHandlesHppFile(&local_8a8);
      VulkanHppGenerator::generateHashHppFile(&local_8a8);
      VulkanHppGenerator::generateMacrosFile(&local_8a8);
      VulkanHppGenerator::generateSharedHppFile(&local_8a8);
      VulkanHppGenerator::generateStaticAssertionsHppFile(&local_8a8);
      VulkanHppGenerator::generateStructsHppFile(&local_8a8);
      VulkanHppGenerator::generateToStringHppFile(&local_8a8);
      VulkanHppGenerator::distributeSecondLevelCommands(&local_8a8);
      VulkanHppGenerator::generateRAIIHppFile(&local_8a8);
      VulkanHppGenerator::~VulkanHppGenerator(&local_8a8);
      iVar2 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"VulkanHppGenerator: failed to load file ",0x28);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_8e8._M_dataplus._M_p,
                          local_8e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," with error <",0xd);
      toString_abi_cxx11_(&local_8a8.m_api,error);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_8a8.m_api._M_dataplus._M_p,local_8a8.m_api._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a8.m_api._M_dataplus._M_p != &local_8a8.m_api.field_2) {
        operator_delete(local_8a8.m_api._M_dataplus._M_p,
                        local_8a8.m_api.field_2._M_allocated_capacity + 1);
      }
      iVar2 = -1;
    }
    tinyxml2::XMLDocument::~XMLDocument(&local_338);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"unsupported api <",0x11);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_8c8._M_dataplus._M_p,local_8c8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    iVar2 = -1;
    std::ostream::flush();
  }
LAB_001eb528:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int main( int argc, char const ** argv )
{
  if ( ( argc % 2 ) == 0 )
  {
    std::cout << "VulkanHppGenerator usage: VulkanHppGenerator [-f filename][-api [vulkan|vulkansc]]" << std::endl;
    std::cout << "\tdefault for filename is <" << VK_SPEC << ">" << std::endl;
    std::cout << "\tdefault for api <vulkan>" << std::endl;
    std::cout << "\tsupported values for api are <vulkan> and <vulkansc>" << std::endl;
    return -1;
  }

  std::string api      = "vulkan";
  std::string filename = VK_SPEC;
  for ( int i = 1; i < argc; i += 2 )
  {
    if ( strcmp( argv[i], "-api" ) == 0 )
    {
      api = argv[i + 1];
    }
    else if ( strcmp( argv[i], "-f" ) == 0 )
    {
      filename = argv[i + 1];
    }
    else
    {
      std::cout << "unsupported argument <" << argv[i] << ">" << std::endl;
      return -1;
    }
  }

  if ( ( api != "vulkan" ) && ( api != "vulkansc" ) )
  {
    std::cout << "unsupported api <" << api << ">" << std::endl;
    return -1;
  }

#if defined( CLANG_FORMAT_EXECUTABLE )
  std::cout << "VulkanHppGenerator: Found ";
  std::string commandString = "\"" CLANG_FORMAT_EXECUTABLE "\" --version ";
  const int   ret           = std::system( commandString.c_str() );
  if ( ret != 0 )
  {
    std::cout << "VulkanHppGenerator: failed to determine clang_format version with error <" << ret << ">\n";
  }
#else
  std::cout << "VulkanHppGenerator: could not find clang-format. The generated files will not be formatted accordingly.\n";
#endif

  tinyxml2::XMLDocument doc;
  std::cout << "VulkanHppGenerator: Loading " << filename << std::endl;
  const tinyxml2::XMLError error = doc.LoadFile( filename.c_str() );
  if ( error != tinyxml2::XML_SUCCESS )
  {
    std::cout << "VulkanHppGenerator: failed to load file " << filename << " with error <" << toString( error ) << ">" << std::endl;
    return -1;
  }

  try
  {
    std::cout << "VulkanHppGenerator: Parsing " << filename << std::endl;
    VulkanHppGenerator generator( doc, api );

    generator.prepareRAIIHandles();
    generator.generateCppModuleFile();
    generator.generateHppFile();
    generator.generateEnumsHppFile();
    generator.generateExtensionInspectionFile();
    generator.generateFormatTraitsHppFile();
    generator.generateFuncsHppFile();
    generator.generateHandlesHppFile();
    generator.generateHashHppFile();
    generator.generateMacrosFile();
    generator.generateSharedHppFile();
    generator.generateStaticAssertionsHppFile();
    generator.generateStructsHppFile();
    generator.generateToStringHppFile();

    // this modifies the generator data and needs to be done after all the other generations are done
    generator.distributeSecondLevelCommands();
    generator.generateRAIIHppFile();
  }
  catch ( std::exception const & e )
  {
    std::cout << "caught exception: " << e.what() << std::endl;
    return -1;
  }
  catch ( ... )
  {
    std::cout << "caught unknown exception" << std::endl;
    return -1;
  }
}